

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_tree_builder.h
# Opt level: O1

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_top_bvh
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *this,
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          *mini_trees)

{
  ulong uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  uint *puVar6;
  Config *pCVar7;
  long *plVar8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  void *pvVar9;
  pointer pNVar10;
  unsigned_long uVar11;
  undefined1 (*pauVar12) [16];
  pointer pBVar13;
  long lVar14;
  ThreadPool *pTVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar18;
  long *plVar19;
  pointer *ppuVar20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> **ppvVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  pointer pBVar25;
  size_t __n;
  size_type __new_size;
  long lVar26;
  code *__new_size_00;
  pointer pNVar27;
  size_type __new_size_01;
  ulong uVar28;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:60:71)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:60:71)>
  __comp_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> prim_offsets;
  vector<unsigned_long,_std::allocator<unsigned_long>_> node_offsets;
  anon_class_16_2_cdc430d5 copy_node;
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> bboxes;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> centers;
  Config config;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *local_190;
  ulong local_188;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_160;
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> local_158;
  unique_lock<std::mutex> local_140;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> local_130;
  _Any_data local_118;
  code *pcStack_108;
  pointer pVStack_100;
  size_t local_f8;
  Config *local_f0;
  vector<bool,_std::allocator<bool>_> local_e8;
  vector<float,_std::allocator<float>_> vStack_c0;
  undefined1 auStack_a8 [32];
  undefined1 auStack_88 [40];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  Config local_58;
  
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::vector
            (&local_130,
             ((long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
             (allocator_type *)local_118._M_pod_data);
  std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::vector
            (&local_158,
             ((long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
             (allocator_type *)local_118._M_pod_data);
  pBVar25 = (mini_trees->
            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((mini_trees->
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pBVar25) {
    lVar18 = 0;
    uVar23 = 0;
    do {
      puVar6 = *(uint **)((long)&(pBVar25->nodes).
                                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4);
      auVar16 = vinsertps_avx(ZEXT416(*puVar6),ZEXT416(puVar6[2]),0x10);
      uVar2 = puVar6[4];
      auVar17 = vinsertps_avx(ZEXT416(puVar6[1]),ZEXT416(puVar6[3]),0x10);
      uVar22 = puVar6[5];
      uVar5 = vmovlps_avx(auVar16);
      *(undefined8 *)
       ((long)((local_158.
                super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->min).values + lVar18 * 2) = uVar5;
      *(uint *)((long)((local_158.
                        super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar18 * 2 + -4) =
           uVar2;
      uVar5 = vmovlps_avx(auVar17);
      *(undefined8 *)
       ((long)((local_158.
                super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar18 * 2) = uVar5;
      *(uint *)((long)((local_158.
                        super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar18 * 2 + 8) =
           uVar22;
      fVar3 = *(float *)((long)((local_158.
                                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->max).values +
                        lVar18 * 2 + 8);
      fVar4 = *(float *)((long)((local_158.
                                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->max).values +
                        lVar18 * 2 + -4);
      auVar16 = vinsertps_avx(ZEXT416((uint)((*(float *)((long)((local_158.
                                                                                                                                  
                                                  super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->max).
                                                  values + lVar18 * 2) +
                                             *(float *)((long)((local_158.
                                                                                                                                
                                                  super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->min).
                                                  values + lVar18 * 2)) * 0.5)),
                              ZEXT416((uint)((*(float *)((long)((local_158.
                                                                                                                                  
                                                  super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->max).
                                                  values + lVar18 * 2 + 4) +
                                             *(float *)((long)((local_158.
                                                                                                                                
                                                  super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->min).
                                                  values + lVar18 * 2 + 4)) * 0.5)),0x10);
      uVar5 = vmovlps_avx(auVar16);
      *(undefined8 *)
       ((long)(local_130.
               super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->values + lVar18) = uVar5;
      *(float *)((long)(local_130.
                        super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->values + lVar18 + 8) =
           (fVar3 + fVar4) * 0.5;
      uVar23 = uVar23 + 1;
      pBVar25 = (mini_trees->
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar18 = lVar18 + 0xc;
    } while (uVar23 < (ulong)(((long)(mini_trees->
                                     super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar25 >>
                              4) * -0x5555555555555555));
  }
  pCVar7 = this->config_;
  local_58.sah.log_cluster_size_ = (pCVar7->super_Config).sah.log_cluster_size_;
  local_58.sah.prim_offset_ = (pCVar7->super_Config).sah.prim_offset_;
  local_58.sah.cost_ratio_ = (pCVar7->super_Config).sah.cost_ratio_;
  local_58.sah._20_4_ = *(undefined4 *)&(pCVar7->super_Config).sah.field_0x14;
  local_f0 = &local_58;
  local_58.min_leaf_size = 1;
  local_58.max_leaf_size = 1;
  __new_size_00 =
       (code *)(((long)local_158.
                       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_158.
                       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  lVar18 = (long)local_130.
                 super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_130.
                 super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2;
  local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(lVar18 * -0x5555555555555555);
  local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_130.
                super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_118._M_unused._M_object = &PTR___cxa_pure_virtual_0011fce8;
  local_118._8_8_ =
       local_158.
       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pVStack_100 = local_130.
                super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_190 = this;
  pcStack_108 = __new_size_00;
  local_f8 = (size_t)local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
  if (__new_size_00 + lVar18 * 0x5555555555555555 != (code *)0x0) {
    __assert_fail("bboxes.size() == centers.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                  ,0x3f,
                  "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                 );
  }
  local_118._M_unused._M_object = &PTR_get_prim_ids_0011fd08;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  auStack_a8._8_24_ = SUB6424(ZEXT864(0),0) << 0x20;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = SUB648(ZEXT864(0),4);
  vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  auStack_a8._0_8_ = 0;
  auStack_88 = (undefined1  [40])0x0;
  std::vector<bool,_std::allocator<bool>_>::resize(&local_e8,(size_type)__new_size_00,false);
  std::vector<float,_std::allocator<float>_>::resize(&vStack_c0,(size_type)__new_size_00);
  local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  do {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (auStack_a8 +
               (long)local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start * 0x18),(size_type)__new_size_00);
    plVar19 = *(long **)(auStack_a8 +
                        (long)local_1a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start * 0x18);
    plVar8 = *(long **)(auStack_a8 +
                       (long)local_1a8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start * 0x18 + 8);
    if (plVar19 != plVar8) {
      lVar18 = 0;
      do {
        *plVar19 = lVar18;
        lVar18 = lVar18 + 1;
        plVar19 = plVar19 + 1;
      } while (plVar19 != plVar8);
    }
    __first._M_current =
         *(unsigned_long **)
          (auStack_a8 +
          (long)local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start * 0x18);
    __last._M_current =
         *(unsigned_long **)
          (auStack_a8 +
          (long)local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start * 0x18 + 8);
    if (__first._M_current != __last._M_current) {
      __comp._M_comp.axis = (size_t *)&local_1a8;
      __comp._M_comp.centers =
           (span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)&local_180;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>>
                (__first,__last,
                 (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >> 3)
                              * 2) ^ 0x7e,__comp);
      __comp_00._M_comp.axis = (size_t *)&local_1a8;
      __comp_00._M_comp.centers =
           (span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)&local_180;
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>>
                (__first,__last,__comp_00);
    }
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
  } while (local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start < (pointer)0x3);
  TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
            (__return_storage_ptr__,
             (TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)&local_118);
  local_118._M_unused._M_object = &PTR_get_prim_ids_0011fd08;
  lVar18 = 0xb0;
  do {
    pvVar9 = *(void **)((long)&local_130.
                               super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar18);
    if (pvVar9 != (void *)0x0) {
      operator_delete(pvVar9,*(long *)((long)&local_118 + lVar18) - (long)pvVar9);
    }
    lVar18 = lVar18 + -0x18;
  } while (lVar18 != 0x68);
  if (vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_180,
             ((long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
             (allocator_type *)local_118._M_pod_data);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_1a8,
             ((long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
             (allocator_type *)local_118._M_pod_data);
  pNVar27 = (__return_storage_ptr__->nodes).
            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar10 = (__return_storage_ptr__->nodes).
            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __new_size = ((long)pNVar10 - (long)pNVar27 >> 2) * 0x6db6db6db6db6db7;
  pBVar25 = (mini_trees->
            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar18 = (long)(mini_trees->
                 super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar25;
  if (lVar18 == 0) {
    __new_size_01 = 0;
  }
  else {
    lVar18 = (lVar18 >> 4) * -0x5555555555555555;
    ppuVar20 = (pointer *)
               ((long)&(pBVar25->prim_ids).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               );
    lVar26 = 0;
    __new_size_01 = 0;
    do {
      *(size_type *)
       ((float *)local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start + lVar26 * 2) = __new_size - 1;
      local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar26] = __new_size_01;
      __new_size = (__new_size - 1) +
                   ((long)ppuVar20[-3] - (long)ppuVar20[-4] >> 2) * 0x6db6db6db6db6db7;
      __new_size_01 =
           ((long)*ppuVar20 - (long)((_Vector_impl_data *)(ppuVar20 + -1))->_M_start >> 3) +
           __new_size_01;
      lVar26 = lVar26 + 1;
      ppuVar20 = ppuVar20 + 6;
    } while (lVar18 + (ulong)(lVar18 == 0) != lVar26);
  }
  local_168 = &local_1a8;
  local_160 = &local_180;
  if (pNVar27 != pNVar10) {
    do {
      uVar2 = (pNVar27->index).value;
      uVar22 = uVar2 & 0xf;
      if (uVar22 != 0) {
        if (uVar22 != 1) {
          __assert_fail("node.index.prim_count() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/mini_tree_builder.h"
                        ,0x11d,
                        "Bvh<Node> bvh::v2::MiniTreeBuilder<bvh::v2::Node<float, 3>>::build_top_bvh(std::vector<Bvh<Node>> &) [Node = bvh::v2::Node<float, 3>, MortonCode = unsigned int]"
                       );
        }
        uVar11 = (__return_storage_ptr__->prim_ids).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2 >> 4];
        pauVar12 = *(undefined1 (**) [16])
                    &(mini_trees->
                     super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar11].nodes.
                     super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                     ._M_impl;
        auVar16 = *pauVar12;
        *(undefined1 (*) [16])((pNVar27->bounds)._M_elems + 3) =
             *(undefined1 (*) [16])(*pauVar12 + 0xc);
        *(undefined1 (*) [16])(pNVar27->bounds)._M_elems = auVar16;
        uVar2 = (pNVar27->index).value;
        ppvVar21 = &local_168;
        if ((pauVar12[1][8] & 0xf) == 0) {
          ppvVar21 = &local_160;
        }
        Index<32UL,_4UL>::Index
                  ((Index<32UL,_4UL> *)&local_118,
                   (ulong)(uVar2 >> 4) +
                   ((*ppvVar21)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar11],(ulong)(uVar2 & 0xf));
        (pNVar27->index).value = local_118._0_4_;
      }
      pNVar27 = pNVar27 + 1;
    } while (pNVar27 != pNVar10);
  }
  std::
  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ::resize(&__return_storage_ptr__->nodes,__new_size);
  local_60 = &__return_storage_ptr__->prim_ids;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_60,__new_size_01);
  pBVar25 = (mini_trees->
            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pBVar13 = (mini_trees->
            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_188 = ((long)pBVar13 - (long)pBVar25 >> 4) * -0x5555555555555555;
  if (local_188 < (local_190->executor_).parallel_threshold) {
    if (pBVar13 != pBVar25) {
      uVar23 = 0;
      do {
        pBVar13 = (mini_trees->
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pBVar25 = pBVar13 + uVar23;
        lVar18 = *(long *)&pBVar13[uVar23].nodes.
                           super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                           ._M_impl;
        if (1 < (ulong)(((long)*(pointer *)
                                ((long)&pBVar13[uVar23].nodes.
                                        super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                        ._M_impl + 8) - lVar18 >> 2) * 0x6db6db6db6db6db7)) {
          uVar28 = 1;
          lVar26 = 0x34;
          do {
            lVar14 = *(long *)((float *)local_180.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar23 * 2);
            pNVar27 = (__return_storage_ptr__->nodes).
                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            auVar16 = *(undefined1 (*) [16])(lVar18 + -0x18 + lVar26);
            *(undefined1 (*) [16])((long)pNVar27[lVar14].bounds._M_elems + lVar26 + -0xc) =
                 *(undefined1 (*) [16])(lVar18 + -0xc + lVar26);
            *(undefined1 (*) [16])((long)(&pNVar27[lVar14].bounds + 0xffffffffffffffff) + lVar26) =
                 auVar16;
            uVar2 = *(uint *)((long)pNVar27[lVar14].bounds._M_elems + lVar26);
            ppvVar21 = &local_168;
            if ((*(byte *)(lVar18 + lVar26) & 0xf) == 0) {
              ppvVar21 = &local_160;
            }
            Index<32UL,_4UL>::Index
                      ((Index<32UL,_4UL> *)&local_118,
                       (ulong)(uVar2 >> 4) +
                       ((*ppvVar21)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar23],(ulong)(uVar2 & 0xf));
            *(undefined4 *)((long)pNVar27[lVar14].bounds._M_elems + lVar26) = local_118._0_4_;
            uVar28 = uVar28 + 1;
            lVar18 = *(long *)&(pBVar25->nodes).
                               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                               ._M_impl;
            lVar26 = lVar26 + 0x1c;
          } while (uVar28 < (ulong)(((long)*(pointer *)
                                            ((long)&(pBVar25->nodes).
                                                                                                        
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl + 8) - lVar18 >> 2) * 0x6db6db6db6db6db7)
                  );
        }
        pvVar9 = (pBVar25->prim_ids).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __n = (long)*(pointer *)
                     ((long)&(pBVar25->prim_ids).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + 8) - (long)pvVar9;
        if (__n != 0) {
          memmove((local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start +
                  local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar23],pvVar9,__n);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != local_188);
    }
  }
  else {
    pTVar15 = (local_190->executor_).thread_pool;
    uVar23 = local_188 /
             (ulong)((long)(pTVar15->threads_).
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pTVar15->threads_).
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3);
    if (pBVar13 != pBVar25) {
      uVar28 = 0;
      do {
        pTVar15 = (local_190->executor_).thread_pool;
        local_118._M_unused._M_object = (void *)0x0;
        local_118._8_8_ = (void *)0x0;
        pcStack_108 = (code *)0x0;
        pVStack_100 = (pointer)0x0;
        local_118._M_unused._M_object = operator_new(0x38);
        uVar1 = uVar28 + uVar23 + (uVar23 == 0);
        uVar24 = local_188;
        if (uVar1 < local_188) {
          uVar24 = uVar1;
        }
        *(vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          **)local_118._M_unused._0_8_ = mini_trees;
        *(vector<unsigned_long,_std::allocator<unsigned_long>_> ***)
         ((long)local_118._M_unused._0_8_ + 8) = &local_168;
        *(Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> **)((long)local_118._M_unused._0_8_ + 0x10) =
             __return_storage_ptr__;
        *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
         ((long)local_118._M_unused._0_8_ + 0x18) = &local_180;
        *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
         ((long)local_118._M_unused._0_8_ + 0x20) = &local_1a8;
        *(ulong *)((long)local_118._M_unused._0_8_ + 0x28) = uVar28;
        *(ulong *)((long)local_118._M_unused._0_8_ + 0x30) = uVar24;
        pVStack_100 = (pointer)std::
                               _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                               ::_M_invoke;
        pcStack_108 = std::
                      _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                      ::_M_manager;
        local_140._M_device = &pTVar15->mutex_;
        local_140._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_140);
        local_140._M_owns = true;
        std::
        deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
        ::emplace_back<std::function<void(unsigned_long)>>
                  ((deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
                    *)&pTVar15->tasks_,(function<void_(unsigned_long)> *)&local_118);
        std::unique_lock<std::mutex>::~unique_lock(&local_140);
        std::condition_variable::notify_one();
        if (pcStack_108 != (code *)0x0) {
          (*pcStack_108)(&local_118,&local_118,3);
        }
        uVar28 = uVar1;
      } while (uVar1 < local_188);
    }
    pTVar15 = (local_190->executor_).thread_pool;
    local_118._M_unused._M_object = &pTVar15->mutex_;
    local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_118);
    local_118._M_pod_data[8] = 1;
    while ((pTVar15->busy_count_ != 0 ||
           (((iterator *)
            ((long)&(pTVar15->tasks_).c.
                    super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                    ._M_impl.super__Deque_impl_data + 0x30))->_M_cur !=
            ((iterator *)
            ((long)&(pTVar15->tasks_).c.
                    super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                    ._M_impl.super__Deque_impl_data + 0x10))->_M_cur))) {
      std::condition_variable::wait((unique_lock *)&pTVar15->done_);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_118);
  }
  if (local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.
      super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.
      super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.
                    super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.
                          super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.
                          super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Bvh<Node> build_top_bvh(std::vector<Bvh<Node>>& mini_trees) {
        // Build a BVH using the mini trees as leaves
        std::vector<Vec> centers(mini_trees.size());
        std::vector<BBox> bboxes(mini_trees.size());
        for (size_t i = 0; i < mini_trees.size(); ++i) {
            bboxes[i] = mini_trees[i].get_root().get_bbox();
            centers[i] = bboxes[i].get_center();
        }

        typename SweepSahBuilder<Node>::Config config = config_;
        config.max_leaf_size = config.min_leaf_size = 1; // Needs to have only one mini-tree in each leaf
        auto bvh = SweepSahBuilder<Node>::build(bboxes, centers, config);

        // Compute the offsets to apply to primitive and node indices
        std::vector<size_t> node_offsets(mini_trees.size());
        std::vector<size_t> prim_offsets(mini_trees.size());
        size_t node_count = bvh.nodes.size();
        size_t prim_count = 0;
        for (size_t i = 0; i < mini_trees.size(); ++i) {
            node_offsets[i] = node_count - 1; // Skip root node
            prim_offsets[i] = prim_count;
            node_count += mini_trees[i].nodes.size() - 1; // idem
            prim_count += mini_trees[i].prim_ids.size();
        }

        // Helper function to copy and fix the child/primitive index of a node
        auto copy_node = [&] (size_t i, Node& dst_node, const Node& src_node) {
            dst_node = src_node;
            dst_node.index.set_first_id(dst_node.index.first_id() +
                (src_node.is_leaf() ? prim_offsets[i] : node_offsets[i]));
        };

        // Make the leaves of the top BVH point to the right internal nodes
        for (auto& node : bvh.nodes) {
            if (!node.is_leaf())
                continue;
            assert(node.index.prim_count() == 1);
            size_t tree_id = bvh.prim_ids[node.index.first_id()];
            copy_node(tree_id, node, mini_trees[tree_id].get_root());
        }

        bvh.nodes.resize(node_count);
        bvh.prim_ids.resize(prim_count);
        executor_.for_each(0, mini_trees.size(),
            [&] (size_t begin, size_t end) {
                for (size_t i = begin; i < end; ++i) {
                    auto& mini_tree = mini_trees[i];

                    // Copy the nodes of the mini tree with the offsets applied, without copying
                    // the root node (since it is already copied to the top-level part of the BVH).
                    for (size_t j = 1; j < mini_tree.nodes.size(); ++j)
                        copy_node(i, bvh.nodes[node_offsets[i] + j], mini_tree.nodes[j]);

                    std::copy(
                        mini_tree.prim_ids.begin(),
                        mini_tree.prim_ids.end(),
                        bvh.prim_ids.begin() + prim_offsets[i]);
                }
            });

        return bvh;
    }